

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O3

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long *__ptr;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  vorbis_info_residue0 *info;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  __ptr = (long *)calloc(1,0x520);
  pvVar1 = vi->codec_setup;
  lVar4 = oggpack_read(opb,0x18);
  *__ptr = lVar4;
  lVar4 = oggpack_read(opb,0x18);
  __ptr[1] = lVar4;
  lVar4 = oggpack_read(opb,0x18);
  *(int *)(__ptr + 2) = (int)lVar4 + 1;
  lVar4 = oggpack_read(opb,6);
  uVar8 = (uint)lVar4 + 1;
  *(uint *)((long)__ptr + 0x14) = uVar8;
  lVar5 = oggpack_read(opb,8);
  iVar2 = (int)lVar5;
  *(int *)(__ptr + 3) = iVar2;
  if ((uint)lVar4 < 0x7fffffff) {
    uVar11 = 0;
    uVar9 = 0;
    do {
      uVar6 = oggpack_read(opb,3);
      lVar4 = oggpack_read(opb,1);
      if (lVar4 != 0) {
        lVar4 = oggpack_read(opb,5);
        uVar6 = uVar6 | lVar4 << 3;
      }
      *(int *)((long)__ptr + uVar11 * 4 + 0x1c) = (int)uVar6;
      iVar3 = 0;
      if ((int)uVar6 != 0) {
        uVar7 = uVar6 & 0xffffffff;
        do {
          uVar10 = (uint)uVar6;
          iVar3 = iVar3 + (uVar10 & 1);
          uVar7 = uVar7 >> 1;
          uVar6 = uVar7;
        } while (1 < uVar10);
      }
      uVar9 = uVar9 + iVar3;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
    if (0 < (int)uVar9) {
      uVar11 = 0;
      do {
        lVar4 = oggpack_read(opb,8);
        *(int *)((long)__ptr + uVar11 * 4 + 0x11c) = (int)lVar4;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    iVar3 = *(int *)((long)pvVar1 + 0x24);
    if (iVar2 < iVar3) {
      if ((int)uVar9 < 1) {
        return __ptr;
      }
      uVar11 = 0;
      while (*(int *)((long)__ptr + uVar11 * 4 + 0x11c) < iVar3) {
        uVar11 = uVar11 + 1;
        if (uVar9 == uVar11) {
          return __ptr;
        }
      }
    }
  }
  else if (iVar2 < *(int *)((long)pvVar1 + 0x24)) {
    return __ptr;
  }
  free(__ptr);
  return (vorbis_info_residue *)0x0;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    if(oggpack_read(opb,1))
      cascade|=(oggpack_read(opb,5)<<3);
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++)
    info->booklist[j]=oggpack_read(opb,8);

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++)
    if(info->booklist[j]>=ci->books)goto errout;

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}